

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::StringValueResult::HandleUnicodeError
          (StringValueResult *this,idx_t col_idx,LinePosition *error_position)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  bool bVar4;
  ulong uVar5;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  string *psVar6;
  bool first_nl;
  CSVReaderOptions *local_120;
  idx_t local_118;
  idx_t local_110;
  CSVReaderOptions *local_108;
  LinesPerBoundary lines_per_batch;
  optional_idx local_f0;
  optional_idx local_e8;
  string borked_line;
  CSVError csv_error;
  
  first_nl = false;
  bVar4 = PrintErrorLine(this);
  FullLinePosition::
  ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
            (&borked_line,&this->current_line_position,&first_nl,&this->buffer_handles,bVar4);
  LinesPerBoundary::LinesPerBoundary
            (&lines_per_batch,(this->iterator->boundary).boundary_idx,*this->lines_read);
  local_108 = (CSVReaderOptions *)col_idx;
  bVar4 = LinePosition::operator==(&(this->current_line_position).begin,error_position);
  if (bVar4) {
    iVar1 = (this->current_line_position).begin.buffer_pos;
    local_120 = ((this->super_ScannerResult).state_machine)->options;
    local_110 = lines_per_batch.boundary_idx;
    local_118 = lines_per_batch.lines_in_batch;
    iVar2 = this->requested_size;
    uVar5 = (ulong)first_nl;
    iVar3 = (this->current_line_position).begin.buffer_idx;
    psVar6 = (string *)0xabe425;
    optional_idx::optional_idx
              (&local_e8,error_position->buffer_pos + uVar5 + error_position->buffer_idx * iVar2);
    error_info.lines_in_batch = (idx_t)&borked_line;
    error_info.boundary_idx = local_118;
    CSVError::InvalidUTF8
              (&csv_error,(CSVError *)local_120,local_108,local_110,error_info,
               (string *)(iVar3 * iVar2 + iVar1 + uVar5),local_e8.index,(optional_idx)&this->path,
               psVar6);
    CSVErrorHandler::Error(this->error_handler,&csv_error,true);
  }
  else {
    iVar1 = (this->current_line_position).begin.buffer_pos;
    local_120 = ((this->super_ScannerResult).state_machine)->options;
    local_110 = lines_per_batch.boundary_idx;
    local_118 = lines_per_batch.lines_in_batch;
    iVar2 = this->requested_size;
    uVar5 = (ulong)first_nl;
    iVar3 = (this->current_line_position).begin.buffer_idx;
    psVar6 = (string *)0xabe4d1;
    optional_idx::optional_idx
              (&local_f0,error_position->buffer_idx * iVar2 + error_position->buffer_pos);
    error_info_00.lines_in_batch = (idx_t)&borked_line;
    error_info_00.boundary_idx = local_118;
    CSVError::InvalidUTF8
              (&csv_error,(CSVError *)local_120,local_108,local_110,error_info_00,
               (string *)(iVar3 * iVar2 + iVar1 + uVar5),local_f0.index,(optional_idx)&this->path,
               psVar6);
    CSVErrorHandler::Error(this->error_handler,&csv_error,true);
  }
  CSVError::~CSVError(&csv_error);
  ::std::__cxx11::string::~string((string *)&borked_line);
  return;
}

Assistant:

void StringValueResult::HandleUnicodeError(idx_t col_idx, LinePosition &error_position) {

	bool first_nl = false;
	auto borked_line = current_line_position.ReconstructCurrentLine(first_nl, buffer_handles, PrintErrorLine());
	LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(), lines_read);
	if (current_line_position.begin == error_position) {
		auto csv_error = CSVError::InvalidUTF8(state_machine.options, col_idx, lines_per_batch, borked_line,
		                                       current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
		                                       error_position.GetGlobalPosition(requested_size, first_nl), path);
		error_handler.Error(csv_error, true);
	} else {
		auto csv_error = CSVError::InvalidUTF8(state_machine.options, col_idx, lines_per_batch, borked_line,
		                                       current_line_position.begin.GetGlobalPosition(requested_size, first_nl),
		                                       error_position.GetGlobalPosition(requested_size), path);
		error_handler.Error(csv_error, true);
	}
}